

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qline.cpp
# Opt level: O2

QDataStream * operator>>(QDataStream *stream,QLine *line)

{
  long in_FS_OFFSET;
  QPoint local_38;
  QPoint local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.xp.m_i = 0;
  local_30.yp.m_i = 0;
  local_38.xp.m_i = 0;
  local_38.yp.m_i = 0;
  operator>>(stream,&local_30);
  operator>>(stream,&local_38);
  line->pt1 = local_30;
  line->pt2 = local_38;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return stream;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &stream, QLine &line)
{
    QPoint p1, p2;
    stream >> p1;
    stream >> p2;
    line = QLine(p1, p2);

    return stream;
}